

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_vacuum.cpp
# Opt level: O2

void __thiscall duckdb::LogicalVacuum::Serialize(LogicalVacuum *this,Serializer *serializer)

{
  LogicalOperator::Serialize(&this->super_LogicalOperator,serializer);
  Serializer::
  WriteProperty<duckdb::unique_ptr<duckdb::VacuumInfo,std::default_delete<duckdb::VacuumInfo>,true>>
            (serializer,200,"info",&this->info);
  Serializer::
  WriteProperty<std::unordered_map<unsigned_long,unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>
            (serializer,0xc9,"column_id_map",&this->column_id_map);
  return;
}

Assistant:

void LogicalVacuum::Serialize(Serializer &serializer) const {
	LogicalOperator::Serialize(serializer);

	serializer.WriteProperty(200, "info", info);
	serializer.WriteProperty(201, "column_id_map", column_id_map);
}